

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleRowDown2Linear_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  long lVar1;
  uint16_t *s;
  
  for (lVar1 = 0; (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    dst[lVar1] = (uint16_t)((uint)src_ptr[lVar1 * 2] + (uint)src_ptr[lVar1 * 2 + 1] + 1 >> 1);
    dst[lVar1 + 1] =
         (uint16_t)((uint)src_ptr[lVar1 * 2 + 2] + (uint)src_ptr[lVar1 * 2 + 3] + 1 >> 1);
  }
  if ((dst_width & 1U) != 0) {
    dst[lVar1] = (uint16_t)((uint)src_ptr[lVar1 * 2] + (uint)src_ptr[lVar1 * 2 + 1] + 1 >> 1);
  }
  return;
}

Assistant:

void ScaleRowDown2Linear_16_C(const uint16_t* src_ptr,
                              ptrdiff_t src_stride,
                              uint16_t* dst,
                              int dst_width) {
  const uint16_t* s = src_ptr;
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (s[0] + s[1] + 1) >> 1;
    dst[1] = (s[2] + s[3] + 1) >> 1;
    dst += 2;
    s += 4;
  }
  if (dst_width & 1) {
    dst[0] = (s[0] + s[1] + 1) >> 1;
  }
}